

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O1

int __thiscall Snes_Spc::cpu_read(Snes_Spc *this,int addr,rel_time_t time)

{
  Timer *t;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Snes_Spc *pSVar5;
  uint uVar6;
  
  pSVar5 = this;
  uVar2 = addr;
  do {
    uVar6 = uVar2;
    uVar3 = (uint)(pSVar5->m).ram.ram[addr];
    if ((int)uVar6 < 0xf0) {
      return uVar3;
    }
    uVar2 = uVar6 - 0x10000;
    if (0xffff00ff < uVar2) {
      return uVar3;
    }
    if (uVar6 - 0xfd < 3) {
      t = (this->m).timers + (uVar6 - 0xfd);
      if (t->next_time <= time) {
        run_timer_(this,t,time);
      }
      iVar4 = t->counter;
      t->counter = 0;
      return iVar4;
    }
    pSVar5 = (Snes_Spc *)(pSVar5[-1].m.ram.ram + 0x104);
  } while (0xfc < (int)uVar6);
  if (uVar6 - 0xf2 < 2) {
    if (uVar2 == 0xffff00f3) {
      iVar4 = dsp_read(this,time);
      return iVar4;
    }
    bVar1 = (this->m).smp_regs[0][2];
  }
  else {
    bVar1 = (pSVar5->m).ram.ram[(long)(addr + -0xf0) + 0xfcf4];
  }
  return (uint)bVar1;
}

Assistant:

int Snes_Spc::cpu_read( int addr, rel_time_t time )
{
	MEM_ACCESS( time, addr )
	
	// RAM
	int result = RAM [addr];
	int reg = addr - 0xF0;
	if ( reg >= 0 ) // 40%
	{
		reg -= 0x10;
		if ( (unsigned) reg >= 0xFF00 ) // 21%
		{
			reg += 0x10 - r_t0out;
			
			// Timers
			if ( (unsigned) reg < timer_count ) // 90%
			{
				Timer* t = &m.timers [reg];
				if ( time >= t->next_time )
					t = run_timer_( t, time );
				result = t->counter;
				t->counter = 0;
			}
			// Other registers
			else if ( reg < 0 ) // 10%
			{
				result = cpu_read_smp_reg( reg + r_t0out, time );
			}
			else // 1%
			{
				assert( reg + (r_t0out + 0xF0 - 0x10000) < 0x100 );
				result = cpu_read( reg + (r_t0out + 0xF0 - 0x10000), time );
			}
		}
	}
	
	return result;
}